

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::WriteEquals
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  uint8_t uVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  string_view text;
  
  uVar1 = ((this->super_FieldGeneratorBase).descriptor_)->type_;
  pcVar3 = "if ($property_name$ != other.$property_name$) return false;\n";
  if (uVar1 == '\x01') {
    pcVar3 = 
    "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
    ;
  }
  __s = 
  "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
  ;
  if (uVar1 != '\x02') {
    __s = pcVar3;
  }
  sVar2 = strlen(__s);
  text._M_str = __s;
  text._M_len = sVar2;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  } else if (descriptor_->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}